

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O0

void __thiscall cmLocalGenerator::AppendFlags(cmLocalGenerator *this,string *flags,string *newFlags)

{
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __first;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __last;
  bool bVar1;
  byte bVar2;
  bool allSpaces;
  string *newFlags_local;
  string *flags_local;
  cmLocalGenerator *this_local;
  
  __first._M_current = (char *)std::__cxx11::string::begin();
  __last._M_current = (char *)std::__cxx11::string::end();
  bVar1 = std::all_of<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,bool(*)(char)>
                    (__first,__last,cmIsSpace);
  bVar2 = std::__cxx11::string::empty();
  if (((bVar2 & 1) == 0) && (!bVar1)) {
    bVar2 = std::__cxx11::string::empty();
    if ((bVar2 & 1) == 0) {
      std::__cxx11::string::operator+=((string *)flags," ");
    }
    std::__cxx11::string::operator+=((string *)flags,(string *)newFlags);
  }
  return;
}

Assistant:

void cmLocalGenerator::AppendFlags(std::string& flags,
                                   const std::string& newFlags) const
{
  bool allSpaces = std::all_of(newFlags.begin(), newFlags.end(), cmIsSpace);

  if (!newFlags.empty() && !allSpaces) {
    if (!flags.empty()) {
      flags += " ";
    }
    flags += newFlags;
  }
}